

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition-optimizer.hxx
# Opt level: O0

double __thiscall
lineage::heuristics::
LocalPartitionOptimizer<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>,_lineage::heuristics::branching::MaskedHungarianBranching<lineage::heuristics::PartitionGraph>_>
::solveLocalBranchingProblem
          (LocalPartitionOptimizer<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>,_lineage::heuristics::branching::MaskedHungarianBranching<lineage::heuristics::PartitionGraph>_>
           *this,size_t partitionIdA,size_t partitionIdB)

{
  MaskedHungarianBranching<lineage::heuristics::PartitionGraph> *in_RDX;
  MaskedHungarianBranching<lineage::heuristics::PartitionGraph> *this_00;
  LocalBranchingOptimizer localBranchingOptimizer;
  size_t in_stack_ffffffffffffff30;
  size_t in_stack_ffffffffffffff38;
  size_t in_stack_ffffffffffffff40;
  PartitionGraph *in_stack_ffffffffffffff48;
  MaskedHungarianBranching<lineage::heuristics::PartitionGraph> *in_stack_ffffffffffffff50;
  
  branching::MaskedHungarianBranching<lineage::heuristics::PartitionGraph>::MaskedHungarianBranching
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  this_00 = (MaskedHungarianBranching<lineage::heuristics::PartitionGraph> *)
            branching::MaskedHungarianBranching<lineage::heuristics::PartitionGraph>::optimize
                      (in_RDX);
  branching::MaskedHungarianBranching<lineage::heuristics::PartitionGraph>::
  ~MaskedHungarianBranching(this_00);
  return (double)this_00;
}

Assistant:

inline double
LocalPartitionOptimizer<BROPT, LBROPT>::solveLocalBranchingProblem(
    size_t partitionIdA, size_t partitionIdB) const
{
    auto localBranchingOptimizer =
        LocalBranchingOptimizer(this->partitionGraph_, partitionIdA,
                                partitionIdB, this->data_.maxDistance);
    return localBranchingOptimizer.optimize();
}